

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrti.h
# Opt level: O2

uint32_t sqrti_5(uint32_t n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0x8000;
  uVar2 = 0x8000;
  while( true ) {
    uVar1 = uVar3;
    if (uVar2 * uVar2 <= n) {
      uVar1 = 0;
    }
    if (uVar3 < 2) break;
    uVar3 = uVar3 >> 1;
    uVar2 = uVar1 ^ uVar2 | uVar3;
  }
  return uVar1 ^ uVar2;
}

Assistant:

uint32_t sqrti_5(uint32_t n)
{
    uint32_t c = 0x8000;
    uint32_t g = 0x8000;
    for (;;)
    {
        if (g * g > n)
        {
            g ^= c;
        }
        c >>= 1;
        if (c == 0)
        {
            return g;
        }
        g |= c;
    }
}